

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrTransformTest(Vec_Ptr_t *vDes)

{
  Abc_Frame_t *pAVar1;
  Mio_Library_t *pLib;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  int i;
  
  Bac_PtrDumpBlif("test1.blif",vDes);
  pAVar1 = Abc_FrameGetGlobalFrame();
  if (pAVar1 == (Abc_Frame_t *)0x0) {
    pcVar2 = "ABC framework is not started.";
  }
  else {
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib != (Mio_Library_t *)0x0) {
      p = Bac_ManCollectGateNamesByTruth(pLib);
      p_00 = Vec_PtrAllocExact(vDes->nSize);
      pcVar2 = (char *)Vec_PtrEntry(vDes,0);
      pcVar2 = Abc_UtilStrsav(pcVar2);
      Vec_PtrPush(p_00,pcVar2);
      for (i = 1; i < vDes->nSize; i = i + 1) {
        pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,i);
        pVVar3 = Bac_PtrTransformNtk(pVVar3,p);
        Vec_PtrPush(p_00,pVVar3);
      }
      Bac_PtrDumpBlif("test2.blif",p_00);
      Vec_PtrFree(p);
      return p_00;
    }
    pcVar2 = "Standard cell library is not entered.";
  }
  puts(pcVar2);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformTest( Vec_Ptr_t * vDes )
{
    Mio_Library_t * pLib;
    Vec_Ptr_t * vGatesNames;
    Vec_Ptr_t * vNtk, * vNew; int i;
    // dump BLIF before transformation
    Bac_PtrDumpBlif( "test1.blif", vDes );
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        printf( "Standard cell library is not entered.\n" );
        return NULL;
    }
    vGatesNames = Bac_ManCollectGateNamesByTruth( pLib );
    // transform
    vNew = Vec_PtrAllocExact( Vec_PtrSize(vDes) );
    Vec_PtrPush( vNew, Abc_UtilStrsav((char *)Vec_PtrEntry(vDes, 0)) );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Vec_PtrPush( vNew, Bac_PtrTransformNtk(vNtk, vGatesNames) );
    // dump BLIF after transformation
    Bac_PtrDumpBlif( "test2.blif", vNew );
    Vec_PtrFree( vGatesNames );
    return vNew;
}